

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::reorg_gradient
               (bool add_to,tensor *grad,int row_stride,int col_stride,tensor *gradient_input)

{
  uint *puVar1;
  thread_pool_implementation *this;
  task_state_type *ptVar2;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  thread_pool *this_00;
  unsigned_long uVar7;
  code *pcVar8;
  uint64 uVar9;
  ostream *poVar10;
  fatal_error *pfVar11;
  long lVar12;
  code *pcVar13;
  code *__stat_loc;
  long lVar14;
  code *pcVar15;
  bool add_to_local;
  string local_220;
  int col_stride_local;
  int row_stride_local;
  code *local_1f8;
  thread_pool *local_1f0;
  code *local_1e8;
  long local_1e0;
  helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2453:59)>_>
  local_1d8;
  ostringstream dlib_o_out;
  int *local_1a8;
  bool *local_1a0;
  float **local_198;
  float **local_190;
  float *g;
  float *gi;
  helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2453:59)>
  local_38;
  
  add_to_local = add_to;
  col_stride_local = col_stride;
  row_stride_local = row_stride;
  if (grad == gradient_input) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x98a);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"!is_same_object(grad, gradient_input)");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_1a8 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,
                              "Grad and gradient_input must be distinct objects.");
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_220);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  lVar14 = (long)row_stride;
  if (grad->m_nr % lVar14 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x98b);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"grad.nr() % row_stride == 0");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_1a8 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,
                              "The number of rows in grad must be divisible by row_stride.");
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_220);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  __stat_loc = (code *)grad->m_nc;
  lVar12 = (long)col_stride;
  if ((long)__stat_loc % lVar12 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x98c);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"grad.nc() % col_stride == 0");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_1a8 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,
                              "The number of columns in grad must be divisible by col_stride.");
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_220);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  if (grad->m_n != gradient_input->m_n) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x98d);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"grad.num_samples() == gradient_input.num_samples()");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_1a8 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,
                              "The number of samples in grad and gradient_input must match.");
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_220);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  lVar6 = gradient_input->m_k / lVar14;
  if (grad->m_k != lVar6 / lVar12) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x98e);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"grad.k() == gradient_input.k() / row_stride / col_stride");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_1a8 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,
                              "The number of channels in grad must be gradient_input.k() divided by row_stride and col_stride."
                             );
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_220);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  if (grad->m_nr != lVar14 * gradient_input->m_nr) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x98f);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"grad.nr() == gradient_input.nr() * row_stride");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_1a8 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,
                              "The number of rows in grad must be gradient_input.nr() multiplied by row_stride."
                             );
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_220);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  if (__stat_loc != (code *)(lVar12 * gradient_input->m_nc)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x990);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,
                              "void dlib::cpu::reorg_gradient(bool, tensor &, const int, const int, const tensor &)"
                             );
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"grad.nc() == gradient_input.nc() * col_stride");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)&local_1a8 + *(long *)((long)_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,
                              "The number of columns in grad must be gradient_input.nc() multiplied by col_stride."
                             );
    std::operator<<(poVar10,"\n");
    pfVar11 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar11,EBROKEN_ASSERT,&local_220);
    __cxa_throw(pfVar11,&fatal_error::typeinfo,error::~error);
  }
  iVar5 = (*gradient_input->_vptr_tensor[2])(gradient_input,__stat_loc,lVar6 % lVar12);
  gi = (float *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*grad->_vptr_tensor[3])(grad);
  g = (float *)CONCAT44(extraout_var_00,iVar5);
  local_198 = &g;
  pcVar13 = (code *)gradient_input->m_n;
  local_1a8 = &col_stride_local;
  local_1a0 = &add_to_local;
  _dlib_o_out = gradient_input;
  local_190 = &gi;
  this_00 = default_thread_pool();
  local_1d8.obj = &local_38;
  local_1d8.funct =
       (offset_in_helper_parallel_for_funct<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_arrufat[P]dlib_pytorch_benchmark_external_dlib_dlib_cuda_cpu_dlib_cpp:2453:59)>_to_subr
        )impl::
         helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2453:59)>
         ::run;
  local_1d8._16_8_ = 0;
  local_38.funct = (anon_class_56_7_7c6c4572 *)&dlib_o_out;
  uVar7 = thread_pool::num_threads_in_pool(this_00);
  if (uVar7 == 0) {
    impl::
    helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2453:59)>_>
    ::process_block(&local_1d8,0,(long)pcVar13);
  }
  else {
    uVar7 = thread_pool::num_threads_in_pool(this_00);
    lVar14 = (long)pcVar13 / (long)(uVar7 << 3);
    local_1e0 = 1;
    if (1 < lVar14) {
      local_1e0 = lVar14;
    }
    pcVar8 = (code *)0x0;
    local_1f0 = this_00;
    local_1e8 = pcVar13;
    while ((long)pcVar8 < (long)local_1e8) {
      this = (local_1f0->impl).
             super___shared_ptr<dlib::thread_pool_implementation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pcVar15 = pcVar8 + local_1e0;
      local_220._M_dataplus._M_p = (pointer)&this->m;
      local_220._M_string_length = 0;
      local_220.field_2._M_allocated_capacity = 0;
      pcVar13 = local_1e8;
      if ((long)pcVar15 < (long)local_1e8) {
        pcVar13 = pcVar15;
      }
      local_1f8 = pcVar8;
      pthread_mutex_lock((pthread_mutex_t *)local_220._M_dataplus._M_p);
      pcVar8 = (code *)pthread_self();
      lVar14 = thread_pool_implementation::find_empty_task_slot(this);
      if (lVar14 == -1) {
        __stat_loc = pcVar8;
        bVar4 = thread_pool_implementation::is_worker_thread(this,(thread_id_type)pcVar8);
        if (!bVar4) goto LAB_0016948c;
        auto_mutex::unlock((auto_mutex *)&local_220);
        __stat_loc = local_1f8;
        impl::
        helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2453:59)>_>
        ::process_block(&local_1d8,(long)local_1f8,(long)pcVar13);
      }
      else {
LAB_0016948c:
        while (lVar14 == -1) {
          signaler::wait(&this->task_done_signaler,__stat_loc);
          lVar14 = thread_pool_implementation::find_empty_task_slot(this);
        }
        (this->tasks).array_elements[lVar14].thread_id = (thread_id_type)pcVar8;
        uVar9 = thread_pool_implementation::make_next_task_id(this,lVar14);
        ptVar2 = (this->tasks).array_elements;
        ptVar2[lVar14].task_id = uVar9;
        (*(code *)**ptVar2[lVar14].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data)();
        puVar3 = (undefined8 *)ptVar2[lVar14].mfp2.super_mfp_kernel_1_base_class<2UL>.mp_memory.data
        ;
        __stat_loc = impl::
                     helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2453:59)>_>
                     ::process_block;
        puVar3[1] = &local_1d8;
        *(undefined4 *)(puVar3 + 2) = 0;
        puVar3[3] = impl::
                    helper_parallel_for<dlib::impl::helper_parallel_for_funct<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp:2453:59)>_>
                    ::process_block;
        puVar3[4] = 0;
        *puVar3 = &PTR__mp_base_base_001fa710;
        ptVar2 = (this->tasks).array_elements;
        ptVar2[lVar14].arg1 = (long)local_1f8;
        ptVar2[lVar14].arg2 = (long)pcVar13;
        pthread_cond_signal((pthread_cond_t *)&(this->task_ready_signaler).cond);
      }
      auto_mutex::~auto_mutex((auto_mutex *)&local_220);
      pcVar8 = pcVar15;
    }
    thread_pool::wait_for_all_tasks(local_1f0);
  }
  return;
}

Assistant:

void reorg_gradient(
            bool add_to,
            tensor& grad,
            const int row_stride,
            const int col_stride,
            const tensor& gradient_input
        )
        {
            DLIB_CASSERT(!is_same_object(grad, gradient_input), "Grad and gradient_input must be distinct objects.");
            DLIB_CASSERT(grad.nr() % row_stride == 0, "The number of rows in grad must be divisible by row_stride.");
            DLIB_CASSERT(grad.nc() % col_stride == 0, "The number of columns in grad must be divisible by col_stride.");
            DLIB_CASSERT(grad.num_samples() == gradient_input.num_samples(), "The number of samples in grad and gradient_input must match.");
            DLIB_CASSERT(grad.k() == gradient_input.k() / row_stride / col_stride, "The number of channels in grad must be gradient_input.k() divided by row_stride and col_stride.");
            DLIB_CASSERT(grad.nr() == gradient_input.nr() * row_stride, "The number of rows in grad must be gradient_input.nr() multiplied by row_stride.");
            DLIB_CASSERT(grad.nc() == gradient_input.nc() * col_stride, "The number of columns in grad must be gradient_input.nc() multiplied by col_stride.");

            const float* gi = gradient_input.host();
            float* g = grad.host();

            parallel_for(0, gradient_input.num_samples(), [&](long n)
            {
                for (long k = 0; k < gradient_input.k(); ++k)
                {
                    for (long r = 0; r < gradient_input.nr(); ++r)
                    {
                        for (long c = 0; c < gradient_input.nc(); ++c)
                        {
                                const auto in_idx = tensor_index(gradient_input, n, k, r, c);
                                const auto out_idx = tensor_index(grad,
                                    n,
                                    k % grad.k(),
                                    r * row_stride + (k / grad.k()) / col_stride,
                                    c * col_stride + (k / grad.k()) % col_stride);
                                
                                if (add_to) g[out_idx] += gi[in_idx];
                                else g[out_idx] = gi[in_idx];
                        }
                    }
                }
            });
        }